

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::pls_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,PlsRemap *var)

{
  uint uVar1;
  SPIRVariable *variable;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  char *local_1c0;
  char *local_1b8;
  string local_1b0 [32];
  string local_190 [32];
  undefined1 local_170 [192];
  uint *local_b0;
  size_t local_a8;
  size_t local_a0;
  uint local_98 [8];
  undefined1 local_78 [28];
  TypeID local_5c;
  __node_base_ptr *local_58;
  size_type local_50;
  __node_base local_48;
  size_type sStack_40;
  float local_38;
  size_t local_30;
  __node_base_ptr p_Stack_28;
  
  variable = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,var->id);
  uVar1 = var->format - PlsRGBA8I;
  if (uVar1 < 6) {
    uVar2 = *(undefined8 *)(&DAT_003a06a8 + (ulong)uVar1 * 8);
  }
  else {
    uVar2 = 0xd00000016;
  }
  local_170._32_8_ = local_170 + 0x38;
  local_170._8_4_ = 0;
  local_170._0_8_ = &PTR__SPIRType_004e8f68;
  local_170._12_4_ = (undefined4)uVar2;
  local_170._20_4_ = 0;
  local_170._28_4_ = 1;
  local_170._40_8_ = 0;
  local_170._48_8_ = 8;
  local_170._88_8_ = local_170 + 0x70;
  local_170._96_8_ = 0;
  local_170._104_8_ = 8;
  local_170._120_4_ = 0;
  local_170[0x7c] = false;
  local_170[0x7d] = false;
  local_170._128_4_ = Generic;
  local_170._136_8_ = local_170 + 0xa0;
  local_170._144_8_ = 0;
  local_170._152_8_ = 8;
  local_b0 = local_98;
  local_a8 = 0;
  local_a0 = 8;
  local_58 = &p_Stack_28;
  local_78._0_7_ = 0;
  local_78._7_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_4_ = ImageFormatUnknown;
  local_78._20_4_ = AccessQualifierReadOnly;
  local_78._24_4_ = 0;
  local_5c.id = 0;
  local_50 = 1;
  local_48._M_nxt = (_Hash_node_base *)0x0;
  sStack_40 = 0;
  local_38 = 1.0;
  local_30 = 0;
  p_Stack_28 = (__node_base_ptr)0x0;
  local_170._16_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  uVar1 = var->format - PlsR11FG11FB10F;
  local_170._24_4_ = local_170._28_4_;
  if ((uVar1 < 0xb) && ((0x7fdU >> (uVar1 & 0x1f) & 1) != 0)) {
    local_170._24_4_ = *(undefined4 *)(&DAT_003a06d8 + (ulong)uVar1 * 4);
    local_170._12_4_ = 0x17;
  }
  if (uVar1 < 0xc) {
    local_1b8 = &DAT_003a0704 + *(int *)(&DAT_003a0704 + (ulong)uVar1 * 4);
  }
  else {
    local_1b8 = "";
  }
  local_1c0 = to_pls_qualifiers_glsl(this,variable);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_190,this,local_170,0);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (local_1b0,this,(ulong)(variable->super_IVariant).self.id,1);
  join<char_const*,char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_1b8,&local_1c0,(char **)local_190,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36c2c9,
             (char (*) [2])local_1b0,in_stack_fffffffffffffe38);
  ::std::__cxx11::string::~string(local_1b0);
  ::std::__cxx11::string::~string(local_190);
  SPIRType::~SPIRType((SPIRType *)local_170);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::pls_decl(const PlsRemap &var)
{
	auto &variable = get<SPIRVariable>(var.id);

	auto op_and_basetype = pls_format_to_basetype(var.format);

	SPIRType type { op_and_basetype.first };
	type.basetype = op_and_basetype.second;
	auto vecsize = pls_format_to_components(var.format);
	if (vecsize > 1)
	{
		type.op = OpTypeVector;
		type.vecsize = vecsize;
	}

	return join(to_pls_layout(var.format), to_pls_qualifiers_glsl(variable), type_to_glsl(type), " ",
	            to_name(variable.self));
}